

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O0

DecodeStatus DecodeFPR128RegisterClass(MCInst *Inst,uint RegNo,uint64_t Addr,void *Decoder)

{
  uint in_ESI;
  MCInst *in_RDI;
  uint Register;
  DecodeStatus local_4;
  
  if (in_ESI < 0x20) {
    MCOperand_CreateReg0(in_RDI,FPR128DecoderTable[in_ESI]);
    local_4 = MCDisassembler_Success;
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeFPR128RegisterClass(MCInst *Inst, unsigned RegNo,
		uint64_t Addr,
		const void *Decoder)
{
	unsigned Register;
	if (RegNo > 31)
		return Fail;

	Register = FPR128DecoderTable[RegNo];
	MCOperand_CreateReg0(Inst, Register);
	return Success;
}